

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

void __thiscall
el::base::TypedConfigurations::setValue<unsigned_long>
          (TypedConfigurations *this,Level level,unsigned_long *value,
          map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
          *confMap,bool includeGlobalLevel)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  mapped_type_conflict1 mVar3;
  mapped_type_conflict1 *pmVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  Level local_1c;
  pair<el::Level,_unsigned_long> local_18;
  
  local_1c = level;
  if ((confMap->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0 && includeGlobalLevel) {
    local_18.second = *value;
    local_18.first = Global;
  }
  else {
    p_Var1 = &(confMap->_M_t)._M_impl.super__Rb_tree_header;
    p_Var2 = (confMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = p_Var2;
    p_Var6 = &p_Var1->_M_header;
    for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[bVar7]) {
      bVar7 = p_Var5[1]._M_color == _S_red;
      if (!bVar7) {
        p_Var6 = p_Var5;
      }
    }
    p_Var5 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var5 = p_Var6, _S_black < p_Var6[1]._M_color)) {
      p_Var5 = &p_Var1->_M_header;
    }
    p_Var6 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && (p_Var5[1]._M_parent == (_Base_ptr)*value)) {
      return;
    }
    for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[bVar7]) {
      bVar7 = p_Var2[1]._M_color < level;
      if (!bVar7) {
        p_Var6 = p_Var2;
      }
    }
    p_Var5 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var5 = p_Var6, level < p_Var6[1]._M_color)) {
      p_Var5 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      mVar3 = *value;
      pmVar4 = utils::std::
               map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
               ::at(confMap,&local_1c);
      *pmVar4 = mVar3;
      return;
    }
    local_18.second = *value;
    local_18.first = level;
  }
  std::
  _Rb_tree<el::Level,std::pair<el::Level_const,unsigned_long>,std::_Select1st<std::pair<el::Level_const,unsigned_long>>,std::less<el::Level>,std::allocator<std::pair<el::Level_const,unsigned_long>>>
  ::_M_emplace_unique<std::pair<el::Level,unsigned_long>>
            ((_Rb_tree<el::Level,std::pair<el::Level_const,unsigned_long>,std::_Select1st<std::pair<el::Level_const,unsigned_long>>,std::less<el::Level>,std::allocator<std::pair<el::Level_const,unsigned_long>>>
              *)confMap,&local_18);
  return;
}

Assistant:

void setValue(Level level, const Conf_T& value, std::map<Level, Conf_T>* confMap, bool includeGlobalLevel = true) {
    // If map is empty and we are allowed to add into generic level (Level::Global), do it!
    if (confMap->empty() && includeGlobalLevel) {
      confMap->insert(std::make_pair(Level::Global, value));
      return;
    }
    // If same value exist in generic level already, dont add it to explicit level
    typename std::map<Level, Conf_T>::iterator it = confMap->find(Level::Global);
    if (it != confMap->end() && it->second == value) {
      return;
    }
    // Now make sure we dont double up values if we really need to add it to explicit level
    it = confMap->find(level);
    if (it == confMap->end()) {
      // Value not found for level, add new
      confMap->insert(std::make_pair(level, value));
    } else {
      // Value found, just update value
      confMap->at(level) = value;
    }
  }